

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::SwiftCompilerShellCommand::constructCommandLineArgs
          (SwiftCompilerShellCommand *this,StringRef outputFileMapPath,
          vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *result)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nameAndAlias;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  StringRef local_50;
  value_type local_40;
  
  local_40.Length = outputFileMapPath.Length;
  local_40.Data = outputFileMapPath.Data;
  local_50.Data = (this->executable)._M_dataplus._M_p;
  local_50.Length = (this->executable)._M_string_length;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  local_50.Data = "-module-name";
  local_50.Length = 0xc;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  local_50.Data = (this->moduleName)._M_dataplus._M_p;
  local_50.Length = (this->moduleName)._M_string_length;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  pbVar1 = (this->moduleAliases).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->moduleAliases).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    local_50.Data = "-module-alias";
    local_50.Length = 0xd;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
    local_50.Data = (pbVar2->_M_dataplus)._M_p;
    local_50.Length = pbVar2->_M_string_length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
  }
  local_50.Data = "-emit-dependencies";
  local_50.Length = 0x12;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  if ((this->moduleOutputPath)._M_string_length != 0) {
    local_50.Data = "-emit-module";
    local_50.Length = 0xc;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
    local_50.Data = "-emit-module-path";
    local_50.Length = 0x11;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
    local_50.Data = (this->moduleOutputPath)._M_dataplus._M_p;
    local_50.Length = (this->moduleOutputPath)._M_string_length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
  }
  local_50.Data = "-output-file-map";
  local_50.Length = 0x10;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(result,&local_40);
  if (this->isLibrary == true) {
    local_50.Data = "-parse-as-library";
    local_50.Length = 0x11;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
  }
  if (this->enableWholeModuleOptimization == true) {
    local_50.Data = "-whole-module-optimization";
    local_50.Length = 0x1a;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
    local_50.Data = "-num-threads";
    local_50.Length = 0xc;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
    local_50.Data = (this->numThreads)._M_dataplus._M_p;
    local_50.Length = (this->numThreads)._M_string_length;
  }
  else {
    local_50.Data = "-incremental";
    local_50.Length = 0xc;
  }
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  local_50.Data = "-c";
  local_50.Length = 2;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (result,&local_50);
  pbVar1 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->sourcesList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    local_50.Data = (pbVar2->_M_dataplus)._M_p;
    local_50.Length = pbVar2->_M_string_length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
  }
  pbVar1 = (this->importPaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->importPaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    local_50.Data = "-I";
    local_50.Length = 2;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
    local_50.Data = (pbVar2->_M_dataplus)._M_p;
    local_50.Length = pbVar2->_M_string_length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
  }
  pbVar1 = (this->otherArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->otherArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    local_50.Data = (pbVar2->_M_dataplus)._M_p;
    local_50.Length = pbVar2->_M_string_length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (result,&local_50);
  }
  return;
}

Assistant:

void constructCommandLineArgs(StringRef outputFileMapPath,
                                std::vector<StringRef>& result) const {
    result.push_back(executable);
    result.push_back("-module-name");
    result.push_back(moduleName);

    for (const auto& nameAndAlias: moduleAliases) {
      // E.g. `-module-alias Foo=Bar`
      result.push_back("-module-alias");
      result.push_back(nameAndAlias);
    }

    result.push_back("-emit-dependencies");
    if (!moduleOutputPath.empty()) {
      result.push_back("-emit-module");
      result.push_back("-emit-module-path");
      result.push_back(moduleOutputPath);
    }
    result.push_back("-output-file-map");
    result.push_back(outputFileMapPath);
    if (isLibrary) {
      result.push_back("-parse-as-library");
    }
    if (enableWholeModuleOptimization) {
      result.push_back("-whole-module-optimization");
      result.push_back("-num-threads");
      result.push_back(numThreads);
    } else {
      result.push_back("-incremental");
    }
    result.push_back("-c");
    for (const auto& source: sourcesList) {
      result.push_back(source);
    }
    for (const auto& import: importPaths) {
      result.push_back("-I");
      result.push_back(import);
    }
    for (const auto& arg: otherArgs) {
      result.push_back(arg);
    }
  }